

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlChar xVar2;
  xmlParserInputState xVar3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  commentSAXFunc p_Var6;
  xmlChar *pxVar7;
  int iVar8;
  xmlChar *pxVar9;
  char *msg;
  ulong len;
  long lVar10;
  xmlChar *pxVar11;
  xmlChar *pxVar12;
  size_t __n;
  ulong uVar13;
  ulong local_48;
  
  uVar13 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar13 = 10000000;
  }
  pxVar5 = ctxt->input;
  pxVar11 = pxVar5->cur;
  if ((((*pxVar11 == '<') && (pxVar11[1] == '!')) && (pxVar11[2] == '-')) && (pxVar11[3] == '-')) {
    xVar3 = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    iVar4 = pxVar5->id;
    pxVar5->cur = pxVar11 + 4;
    pxVar5->col = pxVar5->col + 4;
    if (pxVar11[4] == '\0') {
      xmlParserInputGrow(pxVar5,0xfa);
    }
    if (ctxt->progressive == 0) {
      pxVar5 = ctxt->input;
      if ((500 < (long)pxVar5->cur - (long)pxVar5->base) &&
         ((long)pxVar5->end - (long)pxVar5->cur < 500)) {
        xmlSHRINK(ctxt);
      }
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    pxVar11 = ctxt->input->cur;
    local_48 = 100;
    len = 0;
    pxVar7 = (xmlChar *)0x0;
    do {
      pxVar12 = pxVar7;
      if (*pxVar11 == '\n') {
        pxVar5 = ctxt->input;
        iVar8 = pxVar5->line;
        pxVar7 = pxVar11;
        do {
          iVar8 = iVar8 + 1;
          pxVar5->line = iVar8;
          pxVar5->col = 1;
          pxVar11 = pxVar7 + 1;
          pxVar9 = pxVar7 + 1;
          pxVar7 = pxVar11;
        } while (*pxVar9 == '\n');
      }
LAB_0015b666:
      pxVar5 = ctxt->input;
      iVar8 = pxVar5->col;
      while( true ) {
        for (; (xVar2 = *pxVar11, '-' < (char)xVar2 || (xVar2 == '\t' || (byte)(xVar2 - 0x20) < 0xd)
               ); pxVar11 = pxVar11 + 1) {
          iVar8 = iVar8 + 1;
        }
        pxVar5->col = iVar8;
        if (*pxVar11 != '\n') break;
        iVar8 = pxVar5->line;
        do {
          iVar8 = iVar8 + 1;
          pxVar5->line = iVar8;
          pxVar5->col = 1;
          pxVar7 = pxVar11 + 1;
          pxVar11 = pxVar11 + 1;
        } while (*pxVar7 == '\n');
        iVar8 = 1;
      }
      __n = (long)pxVar11 - (long)pxVar5->cur;
      pxVar7 = pxVar12;
      if (((__n != 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
         (ctxt->sax->comment != (commentSAXFunc)0x0)) {
        if (pxVar12 == (xmlChar *)0x0) {
          if ((*pxVar11 != '-') || (lVar10 = 1, pxVar11[1] != '-')) {
            lVar10 = 100;
          }
          local_48 = lVar10 + __n;
          pxVar7 = (xmlChar *)(*xmlMallocAtomic)(local_48);
          if (pxVar7 == (xmlChar *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            goto LAB_0015b9d3;
          }
          len = 0;
        }
        else if (local_48 <= __n + len + 1) {
          local_48 = local_48 + __n + len + 100;
          pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar12,local_48);
          if (pxVar7 == (xmlChar *)0x0) {
            (*xmlFree)(pxVar12);
            xmlErrMemory(ctxt,(char *)0x0);
            ctxt->instate = xVar3;
            return;
          }
        }
        memcpy(pxVar7 + len,ctxt->input->cur,__n);
        len = len + __n;
        pxVar7[len] = '\0';
      }
      if (uVar13 < len) {
        xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment too big found",(xmlChar *)0x0);
LAB_0015b921:
        (*xmlFree)(pxVar7);
        return;
      }
      pxVar5 = ctxt->input;
      pxVar5->cur = pxVar11;
      pxVar9 = pxVar11;
      if (*pxVar11 == '\n') {
        pxVar9 = pxVar11 + 1;
        pxVar5->line = pxVar5->line + 1;
        pxVar5->col = 1;
      }
      pxVar12 = pxVar7;
      if ((*pxVar9 == '\r') && (pxVar9[1] == '\n')) {
        pxVar5->cur = pxVar9 + 1;
        pxVar5->line = pxVar5->line + 1;
        pxVar11 = pxVar9 + 2;
        pxVar5->col = 1;
        goto LAB_0015b666;
      }
      if (((ctxt->progressive == 0) && (500 < (long)pxVar11 - (long)pxVar5->base)) &&
         ((long)pxVar5->end - (long)pxVar11 < 500)) {
        xmlSHRINK(ctxt);
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015b921;
      pxVar11 = ctxt->input->cur;
      xVar2 = *pxVar11;
      if (xVar2 == '-') {
        if (pxVar11[1] == '-') {
          if (pxVar11[2] == '>') {
            if (ctxt->input->id != iVar4) {
              xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                             "comment doesn\'t start and stop in the same entity\n");
            }
            pxVar5 = ctxt->input;
            pxVar11 = pxVar5->cur;
            pxVar5->cur = pxVar11 + 3;
            pxVar5->col = pxVar5->col + 3;
            if (pxVar11[3] == '\0') {
              xmlParserInputGrow(pxVar5,0xfa);
            }
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                (p_Var6 = ctxt->sax->comment, p_Var6 != (commentSAXFunc)0x0)) &&
               (ctxt->disableSAX == 0)) {
              pxVar11 = "";
              if (pxVar7 != (xmlChar *)0x0) {
                pxVar11 = pxVar7;
              }
              (*p_Var6)(ctxt->userData,pxVar11);
            }
            if (pxVar7 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar7);
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              return;
            }
            goto LAB_0015b9d3;
          }
          if (pxVar7 == (xmlChar *)0x0) {
            msg = "Double hyphen within comment\n";
            pxVar9 = (xmlChar *)0x0;
          }
          else {
            msg = "Double hyphen within comment: <!--%.50s\n";
            pxVar9 = pxVar7;
          }
          xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,msg,pxVar9);
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015b921;
          pxVar11 = pxVar11 + 1;
          piVar1 = &ctxt->input->col;
          *piVar1 = *piVar1 + 1;
        }
        pxVar11 = pxVar11 + 1;
        piVar1 = &ctxt->input->col;
        *piVar1 = *piVar1 + 1;
        goto LAB_0015b666;
      }
    } while ((byte)(xVar2 - 9) < 2 || '\x1f' < (char)xVar2);
    xmlParseCommentComplex(ctxt,pxVar7,len,local_48);
LAB_0015b9d3:
    ctxt->instate = xVar3;
  }
  return;
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    xmlParserInputState state;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;
    int inputid;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;
    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    inputid = ctxt->input->id;
    SKIP(4);
    SHRINK;
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
	    if ((ctxt->sax != NULL) &&
		(ctxt->sax->comment != NULL)) {
		if (buf == NULL) {
		    if ((*in == '-') && (in[1] == '-'))
		        size = nbchar + 1;
		    else
		        size = XML_PARSER_BUFFER_SIZE + nbchar;
		    buf = (xmlChar *) xmlMallocAtomic(size);
		    if (buf == NULL) {
		        xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    len = 0;
		} else if (len + nbchar + 1 >= size) {
		    xmlChar *new_buf;
		    size  += len + nbchar + XML_PARSER_BUFFER_SIZE;
		    new_buf = (xmlChar *) xmlRealloc(buf, size);
		    if (new_buf == NULL) {
		        xmlFree (buf);
			xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    buf = new_buf;
		}
		memcpy(&buf[len], ctxt->input->cur, nbchar);
		len += nbchar;
		buf[len] = 0;
	    }
	}
        if (len > maxLength) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            return;
        }
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
        if (ctxt->instate == XML_PARSER_EOF) {
            xmlFree(buf);
            return;
        }
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    if (ctxt->input->id != inputid) {
			xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
			               "comment doesn't start and stop in the"
                                       " same entity\n");
		    }
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    if (ctxt->instate != XML_PARSER_EOF)
			ctxt->instate = state;
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
                if (ctxt->instate == XML_PARSER_EOF) {
                    xmlFree(buf);
                    return;
                }
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
    ctxt->instate = state;
    return;
}